

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O1

string * gmlc::networking::getLocalExternalAddressV6_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  string *psVar6;
  int iVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  size_type sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  int family;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  resolver resolver;
  string local_178;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  __native_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_e8[0]._M_allocated_capacity = 0;
  local_e8[0]._M_local_buf[8] = '\0';
  local_118._40_8_ = local_e8[0]._M_local_buf + 8;
  AsioContextManager::getContextPointer
            ((AsioContextManager *)local_118,(string *)(local_118 + 0x28));
  if ((char *)local_118._40_8_ != local_e8[0]._M_local_buf + 8) {
    operator_delete((void *)local_118._40_8_,
                    CONCAT71(local_e8[0]._9_7_,local_e8[0]._M_local_buf[8]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_118._0_8_ + 0x40));
  local_130.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 10;
  asio::ip::host_name_abi_cxx11_();
  local_158._0_8_ = &aStack_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)(local_118 + 0x28),(protocol_type *)&local_130,
             &local_178,(string *)local_158,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ != &aStack_148) {
    operator_delete((void *)local_158._0_8_,aStack_148._M_allocated_capacity + 1);
  }
  paVar12 = &local_178.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar12) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_178,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,
             (query *)(local_118 + 0x28));
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length;
  sVar9 = *(size_type *)local_178._M_dataplus._M_p;
  lVar11 = CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
           * 0x60;
  psVar2 = (size_type *)(sVar9 + 8 + lVar11);
  local_118._16_8_ = *psVar2;
  local_118._24_8_ = psVar2[1];
  if (*(short *)(sVar9 + lVar11) == 2) {
    aStack_148._8_4_ = 0;
    local_158._0_8_ = (ulong)*(uint *)(sVar9 + 4 + lVar11) << 0x20;
    local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    aStack_148._M_allocated_capacity = 0;
  }
  else {
    aStack_148._8_4_ = *(undefined4 *)(sVar9 + 0x18 + lVar11);
    local_158._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    local_158._8_8_ = local_118._16_8_;
    aStack_148._M_allocated_capacity = local_118._24_8_;
  }
  asio::ip::address::to_string_abi_cxx11_(&local_178,(address *)local_158);
  netif::getInterfaceAddresses_abi_cxx11_(&local_130,(netif *)0xa,family);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_,
               local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_) ==
      local_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_178._M_string_length;
  }
  else {
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(local_130.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_130.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_),
                       local_130.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_178);
    if (_Var8._M_current ==
        local_130.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_138 = p_Var10;
      local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_148._M_allocated_capacity = aStack_148._M_allocated_capacity & 0xffffffffffffff00;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_158._0_8_ = &aStack_148;
      if (pbVar13 !=
          local_130.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &in_RDI->field_2;
        do {
          (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>();
          iVar7 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (in_RDI,"::1");
          if (iVar7 == 0) {
LAB_003d0e74:
            bVar5 = true;
            bVar4 = false;
          }
          else {
            bVar5 = false;
            sVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,"fe80:",0,5);
            if (sVar9 == 0) {
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ ==
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_158,in_RDI);
              }
              goto LAB_003d0e74;
            }
            bVar4 = true;
          }
          if ((!bVar4) &&
             (pcVar3 = (in_RDI->_M_dataplus)._M_p,
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar3 != paVar1)) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          if (!bVar5) goto LAB_003d0f51;
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 !=
                 local_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      paVar1 = &in_RDI->field_2;
      (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p == paVar12) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                        local_178.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
        }
        else {
          (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
          (in_RDI->field_2)._M_allocated_capacity =
               CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                        local_178.field_2._M_local_buf[0]);
        }
        psVar6 = &local_178;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length;
      }
      else {
        paVar12 = &aStack_148;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._0_8_ == paVar12) {
          paVar1->_M_allocated_capacity = aStack_148._M_allocated_capacity;
          *(ulong *)((long)&in_RDI->field_2 + 8) = CONCAT44(aStack_148._12_4_,aStack_148._8_4_);
        }
        else {
          (in_RDI->_M_dataplus)._M_p = (pointer)local_158._0_8_;
          (in_RDI->field_2)._M_allocated_capacity = aStack_148._M_allocated_capacity;
        }
        psVar6 = (string *)local_158;
        p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_;
      }
      in_RDI->_M_string_length = (size_type)p_Var10;
      (((string *)(&psVar6->_M_string_length + -1))->_M_dataplus)._M_p = (pointer)paVar12;
      psVar6->_M_string_length = 0;
      paVar12->_M_local_buf[0] = '\0';
LAB_003d0f51:
      p_Var10 = local_138;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ != &aStack_148) {
        operator_delete((void *)local_158._0_8_,aStack_148._M_allocated_capacity + 1);
        p_Var10 = local_138;
      }
      goto LAB_003d0f72;
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == paVar12) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_178._M_string_length;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
LAB_003d0f72:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.__data.__list.__next != &local_90) {
    operator_delete(local_c0.__data.__list.__next,(ulong)(local_90._M_allocated_capacity + 1));
  }
  if ((char *)local_c0.__align != local_c0.__size + 0x10) {
    operator_delete((void *)local_c0.__align,local_c0._16_8_ + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getLocalExternalAddressV6()
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    asio::ip::tcp::endpoint endpoint = *it;

    auto resolved_address = endpoint.address().to_string();
#else
    std::string resolved_address;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    if (std::find(
            interface_addresses.begin(),
            interface_addresses.end(),
            resolved_address) != interface_addresses.end()) {
        return resolved_address;
    }

    // Pick an interface that isn't the IPv6 loopback address, ::1/128
    // or an IPv6 link-local address, fe80::/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr != "::1") {
            if (addr.rfind("fe80:", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // No other choices, so return a link local address if one was found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}